

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O0

bool __thiscall
TxIndex::FindTx(TxIndex *this,uint256 *tx_hash,uint256 *block_hash,CTransactionRef *tx)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  char *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  exception *e;
  CDiskTxPos postx;
  AutoFile file;
  CBlockHeader header;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  CBlockHeader *in_stack_fffffffffffffdf0;
  AutoFile *in_stack_fffffffffffffdf8;
  CDiskTxPos *in_stack_fffffffffffffe00;
  CBlockHeader *in_stack_fffffffffffffe08;
  DB *in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe2f;
  FlatFilePos *in_stack_fffffffffffffe30;
  BlockManager *in_stack_fffffffffffffe38;
  LogFlags in_stack_fffffffffffffe50;
  char *flag;
  int source_line;
  undefined4 in_stack_fffffffffffffe64;
  int origin;
  ConstevalFormatString<1U> in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  bool local_131;
  undefined1 local_a8 [48];
  undefined8 local_78;
  Level in_stack_ffffffffffffff90;
  undefined4 uStack_6c;
  undefined8 local_68;
  char (*in_stack_ffffffffffffffa0) [7];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CDiskTxPos::CDiskTxPos
            ((CDiskTxPos *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::unique_ptr<TxIndex::DB,_std::default_delete<TxIndex::DB>_>::operator->
            ((unique_ptr<TxIndex::DB,_std::default_delete<TxIndex::DB>_> *)
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  bVar2 = DB::ReadTxPos(in_stack_fffffffffffffe10,(uint256 *)in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
  if (bVar2) {
    source_line = (int)((ulong)local_a8 >> 0x20);
    ::node::BlockManager::OpenBlockFile
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f);
    bVar2 = AutoFile::IsNull((AutoFile *)
                             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    origin = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe64);
    if (bVar2) {
      flag = "FindTx";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe08,
                 (char *)in_stack_fffffffffffffe00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe08,
                 (char *)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffde8 = 4;
      logging_function._M_str = in_RSI;
      logging_function._M_len = (size_t)in_RDX;
      source_file._M_str = in_RCX;
      source_file._M_len = in_stack_fffffffffffffea0;
      LogPrintFormatInternal<char[7]>
                (logging_function,source_file,source_line,(LogFlags)flag,in_stack_ffffffffffffff90,
                 in_stack_fffffffffffffe98,in_stack_ffffffffffffffa0);
      local_131 = false;
    }
    else {
      CBlockHeader::CBlockHeader
                ((CBlockHeader *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      AutoFile::operator>>(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      AutoFile::seek(in_RDI,(int64_t)in_RCX,origin);
      TransactionSerParams::operator()
                ((TransactionSerParams *)in_stack_fffffffffffffdf8,
                 (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffdf0);
      AutoFile::operator>>
                (in_stack_fffffffffffffdf8,
                 (ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)
                 in_stack_fffffffffffffdf0);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      bVar2 = transaction_identifier<false>::operator!=
                        ((transaction_identifier<false> *)in_stack_fffffffffffffdf8,
                         (uint256 *)in_stack_fffffffffffffdf0);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe08,
                   (char *)in_stack_fffffffffffffe00);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe08,
                   (char *)in_stack_fffffffffffffe00);
        in_stack_fffffffffffffde8 = 4;
        logging_function_00._M_str = in_RSI;
        logging_function_00._M_len = (size_t)in_RDX;
        source_file_00._M_str = in_RCX;
        source_file_00._M_len = in_stack_fffffffffffffea0;
        LogPrintFormatInternal<char[7]>
                  (logging_function_00,source_file_00,source_line,in_stack_fffffffffffffe50,
                   in_stack_ffffffffffffff90,in_stack_fffffffffffffe98,in_stack_ffffffffffffffa0);
        local_131 = false;
      }
      else {
        CBlockHeader::GetHash(in_stack_fffffffffffffe08);
        *in_RDX = local_78;
        in_RDX[1] = CONCAT44(uStack_6c,in_stack_ffffffffffffff90);
        in_RDX[2] = local_68;
        in_RDX[3] = in_stack_ffffffffffffffa0;
        local_131 = true;
      }
    }
    AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  else {
    local_131 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_131;
  }
  __stack_chk_fail();
}

Assistant:

bool TxIndex::FindTx(const uint256& tx_hash, uint256& block_hash, CTransactionRef& tx) const
{
    CDiskTxPos postx;
    if (!m_db->ReadTxPos(tx_hash, postx)) {
        return false;
    }

    AutoFile file{m_chainstate->m_blockman.OpenBlockFile(postx, true)};
    if (file.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }
    CBlockHeader header;
    try {
        file >> header;
        file.seek(postx.nTxOffset, SEEK_CUR);
        file >> TX_WITH_WITNESS(tx);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s\n", __func__, e.what());
        return false;
    }
    if (tx->GetHash() != tx_hash) {
        LogError("%s: txid mismatch\n", __func__);
        return false;
    }
    block_hash = header.GetHash();
    return true;
}